

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aspa_array.c
# Opt level: O3

aspa_status aspa_array_remove(aspa_array *array,size_t index,_Bool free_providers)

{
  long lVar1;
  uint32_t *ptr;
  ulong uVar2;
  aspa_record *paVar3;
  aspa_status aVar4;
  ulong uVar5;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  aVar4 = ASPA_RECORD_NOT_FOUND;
  if ((array != (aspa_array *)0x0) && (uVar2 = (ulong)array->size, index < uVar2)) {
    if ((free_providers) && (ptr = array->data[index].provider_asns, ptr != (uint32_t *)0x0)) {
      lrtr_free(ptr);
      uVar2 = (ulong)array->size;
    }
    uVar5 = (ulong)((int)uVar2 - 1);
    if (index < uVar5) {
      memmove(array->data + index,array->data + index + 1,(~index + uVar2) * 0x18);
      uVar5 = (ulong)(array->size - 1);
    }
    array->size = (uint32_t)uVar5;
    aVar4 = ASPA_SUCCESS;
    if (uVar5 + 1000 < array->capacity) {
      paVar3 = (aspa_record *)lrtr_realloc(array->data,uVar5 + 1000);
      array->data = paVar3;
      array->capacity = (ulong)array->size + 1000;
      aVar4 = ASPA_SUCCESS;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return aVar4;
  }
  __stack_chk_fail();
}

Assistant:

enum aspa_status aspa_array_remove(struct aspa_array *array, size_t index, bool free_providers)
{
	if (!array || index >= array->size || array->size == 0)
		return ASPA_RECORD_NOT_FOUND;

	if (free_providers && array->data[index].provider_asns)
		lrtr_free(array->data[index].provider_asns);

	// No need to move if last element
	if (index < array->size - 1) {
		size_t trailing = (array->size - index - 1) * sizeof(struct aspa_record);

		/*                     trailing
		 *				   /-------------\
		 *   #3 #8 #11  *  #24 #30 #36 #37
		 *   #3 #8 #11 #24 #30 #36 #37
		 *			    ^   ^
		 *		    index   index + 1
		 */
		memmove(&array->data[index], &array->data[index + 1], trailing);
	}

	array->size -= 1;

	// decreasing capacity if possible
	const size_t SIZE_DECREASE_OFFSET = 1000;
	if (array->size + SIZE_DECREASE_OFFSET < array->capacity) {
		array->data = lrtr_realloc(array->data, array->size + SIZE_DECREASE_OFFSET);
		array->capacity = array->size + SIZE_DECREASE_OFFSET;
	}

	return ASPA_SUCCESS;
}